

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Exporter.cpp
# Opt level: O2

Ref<glTF2::Accessor>
ExportData(Asset *a,string *meshName,Ref<glTF2::Buffer> *buffer,size_t count,void *data,Value typeIn
          ,Value typeOut,ComponentType compType,bool isIndices)

{
  uint numCompsIn;
  uint numCompsOut;
  Buffer *this;
  ulong uVar1;
  BufferView *pBVar2;
  Accessor *pAVar3;
  uint uVar4;
  vector<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_> *pvVar5;
  vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *pvVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  size_t sVar10;
  Ref<glTF2::BufferView> RVar11;
  Ref<glTF2::Accessor> RVar12;
  Ref<glTF2::Accessor> acc;
  string local_50;
  
  if (data == (void *)0x0 || count == 0) {
    pvVar6 = (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0;
    uVar8 = 0;
  }
  else {
    numCompsIn = *(uint *)(&DAT_007594a8 + (ulong)typeIn * 0x10);
    numCompsOut = *(uint *)(&DAT_007594a8 + (ulong)typeOut * 0x10);
    uVar4 = glTF2::ComponentTypeSize(compType);
    this = (buffer->vector->super__Vector_base<glTF2::Buffer_*,_std::allocator<glTF2::Buffer_*>_>).
           _M_impl.super__Vector_impl_data._M_start[buffer->index];
    uVar1 = this->byteLength;
    uVar9 = uVar1 % (ulong)uVar4;
    sVar10 = uVar4 * count * (ulong)numCompsOut;
    glTF2::Buffer::Grow(this,uVar9 + sVar10);
    glTF2::Asset::FindUniqueID(&local_50,a,meshName,"view");
    RVar11 = glTF2::LazyDict<glTF2::BufferView>::Create(&a->bufferViews,local_50._M_dataplus._M_p);
    pvVar5 = RVar11.vector;
    uVar7 = RVar11.index;
    std::__cxx11::string::~string((string *)&local_50);
    pBVar2 = (pvVar5->super__Vector_base<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_>)
             ._M_impl.super__Vector_impl_data._M_start[uVar7];
    (pBVar2->buffer).index = buffer->index;
    (pBVar2->buffer).vector = buffer->vector;
    (pvVar5->super__Vector_base<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar7]->byteOffset = uVar9 + uVar1;
    (pvVar5->super__Vector_base<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar7]->byteLength = sVar10;
    (pvVar5->super__Vector_base<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar7]->byteStride = 0;
    (pvVar5->super__Vector_base<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar7]->target = isIndices | BufferViewTarget_ARRAY_BUFFER;
    glTF2::Asset::FindUniqueID(&local_50,a,meshName,"accessor");
    RVar12 = glTF2::LazyDict<glTF2::Accessor>::Create(&a->accessors,local_50._M_dataplus._M_p);
    pvVar6 = RVar12.vector;
    uVar8 = RVar12.index;
    std::__cxx11::string::~string((string *)&local_50);
    pAVar3 = (pvVar6->super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>).
             _M_impl.super__Vector_impl_data._M_start[uVar8];
    (pAVar3->bufferView).vector = pvVar5;
    (pAVar3->bufferView).index = uVar7;
    (pvVar6->super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar8]->byteOffset = 0;
    (pvVar6->super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar8]->componentType = compType;
    (pvVar6->super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar8]->count = count;
    (pvVar6->super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar8]->type = typeOut;
    acc._12_4_ = 0;
    acc.vector = (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)
                 SUB128(RVar12._0_12_,0);
    acc.index = SUB124(RVar12._0_12_,8);
    SetAccessorRange(compType,acc,data,count,numCompsIn,numCompsOut);
    glTF2::Accessor::WriteData
              ((pvVar6->super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>).
               _M_impl.super__Vector_impl_data._M_start[uVar8],count,data,
               (ulong)(uVar4 * numCompsIn));
  }
  RVar12.index = uVar8;
  RVar12.vector = pvVar6;
  RVar12._12_4_ = 0;
  return RVar12;
}

Assistant:

inline Ref<Accessor> ExportData(Asset& a, std::string& meshName, Ref<Buffer>& buffer,
    size_t count, void* data, AttribType::Value typeIn, AttribType::Value typeOut, ComponentType compType, bool isIndices = false)
{
    if (!count || !data) {
        return Ref<Accessor>();
    }

    unsigned int numCompsIn = AttribType::GetNumComponents(typeIn);
    unsigned int numCompsOut = AttribType::GetNumComponents(typeOut);
    unsigned int bytesPerComp = ComponentTypeSize(compType);

    size_t offset = buffer->byteLength;
    // make sure offset is correctly byte-aligned, as required by spec
    size_t padding = offset % bytesPerComp;
    offset += padding;
    size_t length = count * numCompsOut * bytesPerComp;
    buffer->Grow(length + padding);

    // bufferView
    Ref<BufferView> bv = a.bufferViews.Create(a.FindUniqueID(meshName, "view"));
    bv->buffer = buffer;
    bv->byteOffset = offset;
    bv->byteLength = length; //! The target that the WebGL buffer should be bound to.
    bv->byteStride = 0;
    bv->target = isIndices ? BufferViewTarget_ELEMENT_ARRAY_BUFFER : BufferViewTarget_ARRAY_BUFFER;

    // accessor
    Ref<Accessor> acc = a.accessors.Create(a.FindUniqueID(meshName, "accessor"));
    acc->bufferView = bv;
    acc->byteOffset = 0;
    acc->componentType = compType;
    acc->count = count;
    acc->type = typeOut;

    // calculate min and max values
	SetAccessorRange(compType, acc, data, count, numCompsIn, numCompsOut);

    // copy the data
    acc->WriteData(count, data, numCompsIn*bytesPerComp);

    return acc;
}